

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastDecoder(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  byte bVar1;
  uint uVar2;
  int iLit1;
  int Entry;
  uint uVar3;
  ulong uVar4;
  int iMint;
  
  bVar1 = (byte)nNum & 0x1f;
  vRes->nSize = 0;
  uVar3 = 0;
  if (nNum < 1) {
    nNum = uVar3;
  }
  uVar2 = 1 << bVar1;
  if (1 << bVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    Entry = 1;
    for (uVar4 = 0; (uint)nNum != uVar4; uVar4 = uVar4 + 1) {
      iLit1 = Abc_LitNotCond(pNum[uVar4],(uint)((~uVar3 >> ((uint)uVar4 & 0x1f) & 1) != 0));
      Entry = Gia_ManHashAnd(pNew,Entry,iLit1);
    }
    Vec_IntPush(vRes,Entry);
  }
  return;
}

Assistant:

void Wlc_BlastDecoder( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int i, k, nMints = 1 << nNum;
    Vec_IntClear( vRes );
    for ( i = 0; i < nMints; i++ )
    {
        int iMint = 1;
        for ( k = 0; k < nNum; k++ )
            iMint = Gia_ManHashAnd( pNew, iMint, Abc_LitNotCond(pNum[k], !((i >> k) & 1)) );
        Vec_IntPush( vRes, iMint );
    }
}